

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O2

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,int a)

{
  word wVar1;
  
  scfx_mant::scfx_mant(&this->m_mant,4);
  *(undefined8 *)((long)&this->m_msw + 1) = 0;
  this->m_wp = 0;
  this->m_sign = 0;
  this->m_state = normal;
  this->m_msw = 0;
  if (a == 0) {
    set_zero(this,1);
  }
  else {
    scfx_mant::clear(&this->m_mant);
    this->m_lsw = 2;
    this->m_wp = 2;
    wVar1 = -a;
    if (0 < a) {
      wVar1 = a;
    }
    this->m_state = normal;
    this->m_msw = 2;
    (this->m_mant).m_array[2] = wVar1;
    this->m_sign = ((0 < a) - 1) + (uint)(0 < a);
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( int a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a != 0 )
    {
        m_mant.clear();
	m_wp = m_msw = m_lsw = 2;
	m_state = normal;
	if( a > 0 )
	{
	    m_mant[2] = a;
	    m_sign = 1;
	}
	else
	{
	    m_mant[2] = -a;
	    m_sign = -1;
	}
    }
    else
        set_zero();
}